

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmDisplayStatus(void *arg,char *message)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,message,&local_31);
  cmMakefile::DisplayStatus((cmMakefile *)arg,&local_30,-1.0);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

static void CCONV cmDisplayStatus(void* arg, const char* message)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  mf->DisplayStatus(message, -1);
}